

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O3

PSNode * __thiscall
dg::pta::LLVMPointerGraphBuilder::createDynamicAlloc
          (LLVMPointerGraphBuilder *this,CallInst *CInst,AllocationFunction type)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  PSNode *pPVar4;
  size_t *psVar5;
  long *plVar6;
  long lVar7;
  raw_ostream *prVar8;
  PSNode *pPVar9;
  size_t sVar10;
  
  pPVar4 = PointerGraph::create<(dg::pta::PSNodeType)1>((PointerGraph *)this);
  pPVar9 = (PSNode *)0x0;
  if (pPVar4->type == ALLOC) {
    pPVar9 = pPVar4;
  }
  *(undefined1 *)((long)&pPVar9[1]._vptr_PSNode + 1) = 1;
  if (type == ALLOCA) {
LAB_0012198a:
    iVar3 = *(int *)(CInst + 0x14);
    lVar7 = -(ulong)(uint)(iVar3 << 5);
  }
  else {
    if (type != CALLOC) {
      if (type != MALLOC) {
        prVar8 = (raw_ostream *)llvm::errs();
        prVar8 = llvm::operator<<(prVar8,(Value *)CInst);
        llvm::raw_ostream::operator<<(prVar8,"\n");
        abort();
      }
      goto LAB_0012198a;
    }
    *(undefined1 *)&pPVar9[1]._vptr_PSNode = 1;
    iVar3 = *(int *)(CInst + 0x14);
    lVar7 = 0x20 - (ulong)(uint)(iVar3 << 5);
  }
  lVar7 = *(long *)(CInst + lVar7);
  psVar5 = &Offset::UNKNOWN;
  if ((lVar7 == 0) || (*(char *)(lVar7 + 0x10) != '\x10')) {
LAB_001219f9:
    sVar10 = *psVar5;
    if (sVar10 != 0xffffffffffffffff) {
      if ((type != CALLOC) || (sVar10 == 0)) goto LAB_00121a66;
      lVar7 = *(long *)(CInst + -(ulong)(uint)(iVar3 << 5));
      plVar6 = &Offset::UNKNOWN;
      if ((lVar7 == 0) || (*(char *)(lVar7 + 0x10) != '\x10')) {
LAB_00121a52:
        lVar7 = *plVar6;
        if (lVar7 == -1) goto LAB_00121a5b;
      }
      else {
        uVar1 = *(uint *)(lVar7 + 0x20);
        plVar6 = (long *)(lVar7 + 0x18);
        if ((uVar1 < 0x41) ||
           (iVar3 = llvm::APInt::countLeadingZerosSlowCase(), uVar1 - iVar3 < 0x41)) {
          if (0x40 < uVar1) {
            plVar6 = (long *)*plVar6;
          }
          goto LAB_00121a52;
        }
LAB_00121a5b:
        lVar7 = 0;
      }
      sVar10 = sVar10 * lVar7;
      goto LAB_00121a66;
    }
  }
  else {
    uVar1 = *(uint *)(lVar7 + 0x20);
    psVar5 = (size_t *)(lVar7 + 0x18);
    if ((uVar1 < 0x41) || (iVar2 = llvm::APInt::countLeadingZerosSlowCase(), uVar1 - iVar2 < 0x41))
    {
      if (0x40 < uVar1) {
        psVar5 = (size_t *)*psVar5;
      }
      goto LAB_001219f9;
    }
  }
  sVar10 = 0;
LAB_00121a66:
  (pPVar9->super_SubgraphNode<dg::pta::PSNode>).size = sVar10;
  return pPVar9;
}

Assistant:

PSNode *LLVMPointerGraphBuilder::createDynamicAlloc(const llvm::CallInst *CInst,
                                                    AllocationFunction type) {
    using namespace llvm;

    const Value *op;
    uint64_t size = 0, size2 = 0;
    PSNodeAlloc *node = PSNodeAlloc::get(PS.create<PSNodeType::ALLOC>());
    node->setIsHeap();

    switch (type) {
    case AllocationFunction::MALLOC:
        node->setIsHeap();
        /* fallthrough */
    case AllocationFunction::ALLOCA:
        op = CInst->getOperand(0);
        break;
    case AllocationFunction::CALLOC:
        node->setIsHeap();
        node->setZeroInitialized();
        op = CInst->getOperand(1);
        break;
    default:
        errs() << *CInst << "\n";
        assert(0 && "unknown memory allocation type");
        // for NDEBUG
        abort();
    };

    // infer allocated size
    size = llvmutils::getConstantSizeValue(op);
    if (size != 0 && type == AllocationFunction::CALLOC) {
        // if this is call to calloc, the size is given
        // in the first argument too
        size2 = llvmutils::getConstantSizeValue(CInst->getOperand(0));
        // if both ops are constants, multiply them to get
        // the correct size, otherwise return 0 (unknown)
        size = size2 != 0 ? size * size2 : 0;
    }

    node->setSize(size);
    return node;
}